

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

double DamageTypeDefinition::GetMobjDamageFactor(FName *type,DmgFactors *factors)

{
  uint uVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  
  uVar1 = type->Index;
  if (factors != (DmgFactors *)0x0) {
    pNVar2 = (factors->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>).Nodes;
    pNVar4 = pNVar2 + ((factors->
                       super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>).Size -
                       1 & uVar1);
    do {
      pNVar5 = pNVar4;
      if ((pNVar5 == (Node *)0x0) || (pNVar5->Next == (Node *)0x1)) {
        if (uVar1 == 0) {
          return 1.0;
        }
        goto LAB_0039e542;
      }
      pNVar4 = pNVar5->Next;
    } while ((pNVar5->Pair).Key.Index != uVar1);
LAB_0039e5e4:
    return (pNVar5->Pair).Value;
  }
  if (uVar1 == 0) {
    return 1.0;
  }
  pNVar3 = GlobalDamageDefinitions.Nodes + (GlobalDamageDefinitions.Size - 1 & uVar1);
  do {
    pNVar6 = pNVar3;
    if (pNVar6 == (Node *)0x0) {
      return 1.0;
    }
    if (pNVar6->Next == (Node *)0x1) {
      return 1.0;
    }
    pNVar3 = pNVar6->Next;
  } while ((pNVar6->Pair).Key.Index != uVar1);
  goto LAB_0039e5ef;
  while (pNVar2 = pNVar5->Next, (pNVar5->Pair).Key.Index != 0) {
LAB_0039e542:
    pNVar5 = pNVar2;
    if ((pNVar5 == (Node *)0x0) || (pNVar5->Next == (Node *)0x1)) {
      pNVar5 = (Node *)0x0;
      break;
    }
  }
  pNVar3 = GlobalDamageDefinitions.Nodes + (GlobalDamageDefinitions.Size - 1 & uVar1);
  do {
    pNVar6 = pNVar3;
    if ((pNVar6 == (Node *)0x0) || (pNVar6->Next == (Node *)0x1)) {
      pNVar6 = (Node *)0x0;
      break;
    }
    pNVar3 = pNVar6->Next;
  } while ((pNVar6->Pair).Key.Index != uVar1);
  if (pNVar5 == (Node *)0x0) {
    if (pNVar6 == (Node *)0x0) {
      return 1.0;
    }
  }
  else {
    if (pNVar6 == (Node *)0x0) goto LAB_0039e5e4;
    if ((pNVar6->Pair).Value.ReplaceFactor != true) {
      return (pNVar5->Pair).Value * (pNVar6->Pair).Value.DefaultFactor;
    }
  }
LAB_0039e5ef:
  return (pNVar6->Pair).Value.DefaultFactor;
}

Assistant:

double DamageTypeDefinition::GetMobjDamageFactor(FName type, DmgFactors const * const factors)
{
	if (factors)
	{
		// If the actor has named damage factors, look for a specific factor

		auto pdf = factors->CheckKey(type);
		if (pdf) return *pdf; // type specific damage type
		
		// If this was nonspecific damage, don't fall back to nonspecific search
		if (type == NAME_None) return 1.;
	}
	
	// If this was nonspecific damage, don't fall back to nonspecific search
	else if (type == NAME_None) 
	{ 
		return 1.;
	}
	else
	{
		// Normal is unsupplied / 1.0, so there's no difference between modifying and overriding
		DamageTypeDefinition *dtd = Get(type);
		return dtd ? dtd->DefaultFactor : 1.;
	}
	
	{
		auto pdf  = factors->CheckKey(NAME_None);
		DamageTypeDefinition *dtd = Get(type);
		// Here we are looking for modifications to untyped damage
		// If the calling actor defines untyped damage factor, that is contained in "pdf".
		if (pdf) // normal damage available
		{
			if (dtd)
			{
				if (dtd->ReplaceFactor) return dtd->DefaultFactor; // use default instead of untyped factor
				return *pdf * dtd->DefaultFactor; // use default as modification of untyped factor
			}
			return *pdf; // there was no default, so actor default is used
		}
		else if (dtd)
		{
			return dtd->DefaultFactor; // implicit untyped factor 1.0 does not need to be applied/replaced explicitly
		}
	}
	return 1.;
}